

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

string * vkt::image::anon_unknown_0::getCoordStr
                   (string *__return_storage_ptr__,ImageType imageType,string *x,string *y,string *z
                   )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (imageType < IMAGE_TYPE_LAST) {
    if ((0x78U >> (imageType & 0x1f) & 1) == 0) {
      if ((6U >> (imageType & 0x1f) & 1) == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)x);
        return __return_storage_ptr__;
      }
      std::operator+(&local_80,"ivec2(",x);
      std::operator+(&local_a0,&local_80,",");
      std::operator+(&local_c0,&local_a0,y);
      std::operator+(__return_storage_ptr__,&local_c0,")");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      this = &local_80;
    }
    else {
      std::operator+(&local_40,"ivec3(",x);
      std::operator+(&local_60,&local_40,",");
      std::operator+(&local_80,&local_60,y);
      std::operator+(&local_a0,&local_80,",");
      std::operator+(&local_c0,&local_a0,z);
      std::operator+(__return_storage_ptr__,&local_c0,")");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      this = &local_40;
    }
    std::__cxx11::string::~string((string *)this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

static string getCoordStr (const ImageType		imageType,
						   const std::string&	x,
						   const std::string&	y,
						   const std::string&	z)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return x;
		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return string("ivec2(" + x + "," + y + ")");
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return string("ivec3(" + x + "," + y + "," + z + ")");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}